

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O0

void helper_mulsaq_s_l_pw_mips64el
               (target_ulong rs,target_ulong rt,uint32_t ac,CPUMIPSState_conflict5 *env)

{
  ulong uVar1;
  ulong uVar2;
  int64_t iVar3;
  ulong uVar4;
  bool bVar5;
  int64_t temp_sum;
  int64_t acc [2];
  int64_t temp [2];
  int64_t tempA [2];
  int64_t tempB [2];
  int32_t rt0;
  int32_t rt1;
  int32_t rs0;
  int32_t rs1;
  CPUMIPSState_conflict5 *env_local;
  uint32_t ac_local;
  target_ulong rt_local;
  target_ulong rs_local;
  
  uVar2 = mipsdsp_mul_q31_q31(ac,(uint32_t)(rs >> 0x20),(uint32_t)(rt >> 0x20),env);
  iVar3 = mipsdsp_mul_q31_q31(ac,(uint32_t)rs,(uint32_t)rt,env);
  bVar5 = (long)uVar2 < 0;
  uVar1 = (env->active_tc).LO[ac];
  acc[0] = (env->active_tc).HI[ac];
  uVar4 = uVar2 - iVar3;
  if (uVar2 < uVar4) {
    bVar5 = !bVar5;
  }
  if ((bool)(bVar5 ^ iVar3 < 0)) {
    temp[0] = -1;
  }
  else {
    temp[0] = 0;
  }
  uVar2 = uVar1 + uVar4;
  if ((uVar2 < uVar1) && (uVar2 < uVar4)) {
    acc[0] = acc[0] + 1;
  }
  (env->active_tc).HI[ac] = temp[0] + acc[0];
  (env->active_tc).LO[ac] = uVar2;
  return;
}

Assistant:

void helper_mulsaq_s_l_pw(target_ulong rs, target_ulong rt, uint32_t ac,
                          CPUMIPSState *env)
{
    int32_t rs1, rs0;
    int32_t rt1, rt0;
    int64_t tempB[2], tempA[2];
    int64_t temp[2];
    int64_t acc[2];
    int64_t temp_sum;

    rs1 = (rs >> 32) & MIPSDSP_LLO;
    rs0 = rs & MIPSDSP_LLO;
    rt1 = (rt >> 32) & MIPSDSP_LLO;
    rt0 = rt & MIPSDSP_LLO;

    tempB[0] = mipsdsp_mul_q31_q31(ac, rs1, rt1, env);
    tempA[0] = mipsdsp_mul_q31_q31(ac, rs0, rt0, env);

    if (tempB[0] >= 0) {
        tempB[1] = 0x00;
    } else {
        tempB[1] = ~0ull;
    }

    if (tempA[0] >= 0) {
        tempA[1] = 0x00;
    } else {
        tempA[1] = ~0ull;
    }

    acc[0] = env->active_tc.LO[ac];
    acc[1] = env->active_tc.HI[ac];

    temp_sum = tempB[0] - tempA[0];
    if ((uint64_t)temp_sum > (uint64_t)tempB[0]) {
        tempB[1] -= 1;
    }
    temp[0] = temp_sum;
    temp[1] = tempB[1] - tempA[1];

    if ((temp[1] & 0x01) == 0) {
        temp[1] = 0x00;
    } else {
        temp[1] = ~0ull;
    }

    temp_sum = acc[0] + temp[0];
    if (((uint64_t)temp_sum < (uint64_t)acc[0]) &&
       ((uint64_t)temp_sum < (uint64_t)temp[0])) {
        acc[1] += 1;
    }
    acc[0] = temp_sum;
    acc[1] += temp[1];

    env->active_tc.HI[ac] = acc[1];
    env->active_tc.LO[ac] = acc[0];
}